

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_test.cpp
# Opt level: O2

void test_number(void)

{
  uint __line;
  bool bVar1;
  int iVar2;
  value_t *this;
  size_t sVar3;
  size_t sVar4;
  undefined4 extraout_var;
  value_t *pvVar5;
  char *__assertion;
  value_hash_t local_31;
  number_t local_30;
  
  deci::number_t::number_t(&local_30,100.0);
  if ((local_30.val != 100.0) || (NAN(local_30.val))) {
    __assertion = "number_t(100.0).Value() == 100.0";
    __line = 0x11;
  }
  else {
    deci::number_t::~number_t(&local_30);
    deci::number_t::number_t(&local_30,200.0);
    if ((local_30.val != 200.0) || (NAN(local_30.val))) {
      __assertion = "number_t(200.0).Value() == 200.0";
      __line = 0x12;
    }
    else {
      deci::number_t::~number_t(&local_30);
      deci::number_t::number_t(&local_30,0.0);
      if ((local_30.val != 0.0) || (NAN(local_30.val))) {
        __assertion = "number_t(0.0).Value() == 0.0";
        __line = 0x13;
      }
      else {
        deci::number_t::~number_t(&local_30);
        deci::number_t::number_t(&local_30,123.0);
        this = deci::number_t::Copy(&local_30);
        deci::number_t::~number_t(&local_30);
        iVar2 = (*this->_vptr_value_t[1])(this);
        if (iVar2 == 0) {
          sVar3 = deci::value_t::Hash(this);
          deci::number_t::number_t(&local_30,123.0);
          sVar4 = deci::value_t::Hash(&local_30.super_value_t);
          if (sVar3 == sVar4) {
            deci::number_t::~number_t(&local_30);
            iVar2 = (*this->_vptr_value_t[2])(this);
            pvVar5 = (value_t *)CONCAT44(extraout_var,iVar2);
            if (this == pvVar5) {
              __assertion = "item != copy";
              __line = 0x19;
            }
            else {
              sVar3 = deci::value_hash_t::operator()((value_hash_t *)&local_30,this);
              sVar4 = deci::value_hash_t::operator()(&local_31,pvVar5);
              if (sVar3 == sVar4) {
                bVar1 = deci::value_equal_to_t::operator()
                                  ((value_equal_to_t *)&local_30,this,pvVar5);
                if (bVar1) {
                  (*pvVar5->_vptr_value_t[3])(pvVar5);
                  deci::number_t::number_t(&local_30,100.0);
                  pvVar5 = deci::number_t::Copy(&local_30);
                  deci::number_t::~number_t(&local_30);
                  bVar1 = deci::value_equal_to_t::operator()
                                    ((value_equal_to_t *)&local_30,this,pvVar5);
                  if (!bVar1) {
                    (*pvVar5->_vptr_value_t[3])(pvVar5);
                    (*this->_vptr_value_t[3])(this);
                    return;
                  }
                  __assertion = "value_equal_to_t()(item, copy) == false";
                  __line = 0x1f;
                }
                else {
                  __assertion = "value_equal_to_t()(item, copy) == true";
                  __line = 0x1b;
                }
              }
              else {
                __assertion = "value_hash_t()(item) == value_hash_t()(copy)";
                __line = 0x1a;
              }
            }
          }
          else {
            __assertion = "item->Hash() == number_t(123.0).Hash()";
            __line = 0x17;
          }
        }
        else {
          __assertion = "item->Type() == value_t::NUMBER";
          __line = 0x16;
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                ,__line,"void test_number()");
}

Assistant:

void test_number() {
  using namespace deci;

  assert(number_t(100.0).Value() == 100.0);
  assert(number_t(200.0).Value() == 200.0);
  assert(number_t(0.0).Value() == 0.0);

  value_t* item = number_t(123.0).Copy();
  assert(item->Type() == value_t::NUMBER);
  assert(item->Hash() == number_t(123.0).Hash());
  value_t* copy = item->Copy();
  assert(item != copy);
  assert(value_hash_t()(item) == value_hash_t()(copy));
  assert(value_equal_to_t()(item, copy) == true);

  copy->Delete();
  copy = number_t(100.0).Copy();
  assert(value_equal_to_t()(item, copy) == false);

  copy->Delete();
  item->Delete();
}